

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O0

QBitArray * __thiscall QBitArray::inverted_inplace(QBitArray *this)

{
  long lVar1;
  qsizetype qVar2;
  DataPtr *this_00;
  byte *pbVar3;
  QByteArray *in_RSI;
  anon_class_24_3_68a6a72a *in_RDI;
  long in_FS_OFFSET;
  uchar tailMask;
  int tailCount;
  qsizetype i;
  uchar bitdiff;
  uchar *src;
  QBitArray *result;
  uchar *dst;
  qsizetype n;
  QByteArrayData *in_stack_ffffffffffffff48;
  QArrayDataPointer<char> *in_stack_ffffffffffffff50;
  anon_class_24_3_68a6a72a *this_01;
  long local_80;
  byte local_75;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  qVar2 = QByteArray::size(in_RSI);
  this_00 = data_ptr((QBitArray *)0x588404);
  pbVar3 = (byte *)QArrayDataPointer<char>::data(this_00);
  this_01->dst = (uchar **)&DAT_aaaaaaaaaaaaaaaa;
  this_01->this = (QBitArray *)&DAT_aaaaaaaaaaaaaaaa;
  this_01->n = (qsizetype *)&DAT_aaaaaaaaaaaaaaaa;
  inverted_inplace::anon_class_24_3_68a6a72a::operator()(this_01);
  QBitArray((QBitArray *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  QArrayDataPointer<char>::~QArrayDataPointer(in_stack_ffffffffffffff50);
  local_75 = 8;
  if (qVar2 != 0) {
    local_75 = *pbVar3;
    *pbVar3 = local_75;
  }
  for (local_80 = 1; local_80 < qVar2; local_80 = local_80 + 1) {
    pbVar3[local_80] = pbVar3[local_80] ^ 0xff;
  }
  if (0x10 - (uint)local_75 != 8) {
    pbVar3[qVar2 + -1] =
         pbVar3[qVar2 + -1] & (char)(1 << ((byte)(0x10 - (uint)local_75) & 0x1f)) - 1U;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QBitArray *)in_RDI;
}

Assistant:

Q_NEVER_INLINE QBitArray QBitArray::inverted_inplace() &&
{
    qsizetype n = d.size();
    uchar *dst = reinterpret_cast<uchar *>(data_ptr().data());
    const uchar *src = dst;
    QBitArray result([&] {
        if (d.isDetached() || n == 0)
            return std::move(d.data_ptr());     // invert in-place

        QByteArrayData tmp(n, n);
        dst = reinterpret_cast<uchar *>(tmp.data());
        return tmp;
    }());

    uchar bitdiff = 8;
    if (n)
        bitdiff = dst[0] = src[0];      // copy the count of bits in the last byte

    for (qsizetype i = 1; i < n; ++i)
        dst[i] = ~src[i];

    if (int tailCount = 16 - bitdiff; tailCount != 8) {
        // zero the bits beyond our size in the last byte
        Q_ASSERT(n > 1);
        uchar tailMask = (1U << tailCount) - 1;
        dst[n - 1] &= tailMask;
    }

    return result;
}